

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  ulong *puVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  ulong local_b0;
  ulong local_a8;
  
  if (bmi2 != 0) {
    sVar9 = ZSTD_encodeSequences_bmi2
                      (dst,dstCapacity,CTable_MatchLength,mlCodeTable,CTable_OffsetBits,ofCodeTable,
                       CTable_LitLength,llCodeTable,sequences,nbSeq,longOffsets);
    return sVar9;
  }
  if (dstCapacity < 9) {
    return 0xffffffffffffffba;
  }
  uVar4 = (ushort)*CTable_MatchLength;
  uVar20 = (ulong)mlCodeTable[nbSeq - 1];
  lVar10 = (long)(1 << ((char)uVar4 - 1U & 0x1f));
  if (uVar4 == 0) {
    lVar10 = 1;
  }
  uVar27 = CTable_MatchLength[lVar10 + uVar20 * 2 + 2] + 0x8000;
  uVar5 = (ushort)*CTable_OffsetBits;
  bVar1 = ofCodeTable[nbSeq - 1];
  uVar11 = (ulong)bVar1;
  lVar15 = (long)(1 << ((char)uVar5 - 1U & 0x1f));
  if (uVar5 == 0) {
    lVar15 = 1;
  }
  uVar24 = CTable_OffsetBits[lVar15 + uVar11 * 2 + 2] + 0x8000;
  local_b0 = (ulong)*(ushort *)
                     ((long)CTable_MatchLength +
                     (long)(int)CTable_MatchLength[lVar10 + uVar20 * 2 + 1] * 2 +
                     (ulong)((uVar27 & 0xffff0000) - CTable_MatchLength[lVar10 + uVar20 * 2 + 2] >>
                            ((byte)(uVar27 >> 0x10) & 0x3f)) * 2 + 4);
  local_a8 = (ulong)*(ushort *)
                     ((long)CTable_OffsetBits +
                     (long)(int)CTable_OffsetBits[lVar15 + uVar11 * 2 + 1] * 2 +
                     (ulong)((uVar24 & 0xffff0000) - CTable_OffsetBits[lVar15 + uVar11 * 2 + 2] >>
                            ((byte)(uVar24 >> 0x10) & 0x3f)) * 2 + 4);
  uVar6 = (ushort)*CTable_LitLength;
  lVar16 = (long)(1 << ((char)uVar6 - 1U & 0x1f));
  if (uVar6 == 0) {
    lVar16 = 1;
  }
  uVar18 = (ulong)llCodeTable[nbSeq - 1];
  uVar27 = CTable_LitLength[lVar16 + uVar18 * 2 + 2] + 0x8000;
  uVar7 = *(ushort *)
           ((long)CTable_LitLength +
           (long)(int)CTable_LitLength[lVar16 + uVar18 * 2 + 1] * 2 +
           (ulong)((uVar27 & 0xffff0000) - CTable_LitLength[lVar16 + uVar18 * 2 + 2] >>
                  ((byte)(uVar27 >> 0x10) & 0x3f)) * 2 + 4);
  bVar2 = ""[uVar18];
  uVar18 = (ulong)((uint)sequences[nbSeq - 1].mlBase & BIT_mask[""[uVar20]]) << (bVar2 & 0x3f) |
           (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[bVar2]);
  uVar27 = (uint)""[uVar20] + (uint)bVar2;
  puVar17 = (ulong *)((long)dst + (dstCapacity - 8));
  puVar13 = (ulong *)dst;
  if (longOffsets == 0) {
    uVar18 = (ulong)(BIT_mask[uVar11] & sequences[nbSeq - 1].offBase) << ((byte)uVar27 & 0x3f) |
             uVar18;
    uVar27 = uVar27 + bVar1;
    goto LAB_0015a9ea;
  }
  if (bVar1 < 0x38) {
    uVar24 = sequences[nbSeq - 1].offBase;
LAB_0015a985:
    uVar20 = 0;
  }
  else {
    uVar24 = sequences[nbSeq - 1].offBase;
    if (bVar1 == 0x38) {
      uVar11 = 0x38;
      goto LAB_0015a985;
    }
    uVar20 = (ulong)(bVar1 - 0x38);
    uVar18 = (ulong)(BIT_mask[uVar20] & uVar24) << ((byte)uVar27 & 0x3f) | uVar18;
    uVar27 = (uVar27 + bVar1) - 0x38;
    puVar13 = (ulong *)((ulong)(uVar27 >> 3) + (long)dst);
    if (puVar17 < puVar13) {
      puVar13 = puVar17;
    }
    *(ulong *)dst = uVar18;
    uVar18 = uVar18 >> ((byte)uVar27 & 0x38);
    uVar27 = uVar27 & 7;
    uVar11 = 0x38;
  }
  uVar18 = (ulong)(uVar24 >> ((byte)uVar20 & 0x1f) & BIT_mask[uVar11]) << ((byte)uVar27 & 0x3f) |
           uVar18;
  uVar27 = uVar27 + (int)uVar11;
LAB_0015a9ea:
  puVar19 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar13);
  if (puVar17 < puVar19) {
    puVar19 = puVar17;
  }
  *puVar13 = uVar18;
  uVar18 = uVar18 >> ((byte)uVar27 & 0x38);
  uVar27 = uVar27 & 7;
  if (1 < nbSeq) {
    uVar20 = nbSeq - 2;
    do {
      uVar25 = (ulong)llCodeTable[uVar20];
      bVar1 = ofCodeTable[uVar20];
      uVar23 = (ulong)bVar1;
      uVar26 = (ulong)mlCodeTable[uVar20];
      uVar11 = CTable_OffsetBits[lVar15 + uVar23 * 2 + 2] + local_a8;
      uVar24 = (uint)local_a8;
      iVar8 = (int)(uVar11 >> 0x10) + uVar27;
      local_a8 = (ulong)*(ushort *)
                         ((long)CTable_OffsetBits +
                         (long)(int)CTable_OffsetBits[lVar15 + uVar23 * 2 + 1] * 2 +
                         (local_a8 >> ((byte)(uVar11 >> 0x10) & 0x3f)) * 2 + 4);
      uVar21 = CTable_MatchLength[lVar10 + uVar26 * 2 + 2] + local_b0;
      uVar28 = (uint)local_b0;
      iVar14 = (int)(uVar21 >> 0x10) + iVar8;
      uVar12 = (ulong)CTable_LitLength[lVar16 + uVar25 * 2 + 2] + (ulong)uVar7;
      local_b0 = (ulong)*(ushort *)
                         ((long)CTable_MatchLength +
                         (long)(int)CTable_MatchLength[lVar10 + uVar26 * 2 + 1] * 2 +
                         (local_b0 >> ((byte)(uVar21 >> 0x10) & 0x3f)) * 2 + 4);
      uVar18 = (ulong)(BIT_mask[uVar12 >> 0x10] & (uint)uVar7) << ((byte)iVar14 & 0x3f) |
               (ulong)(BIT_mask[uVar21 >> 0x10] & uVar28) << ((byte)iVar8 & 0x3f) |
               (ulong)(BIT_mask[uVar11 >> 0x10] & uVar24) << (sbyte)uVar27 | uVar18;
      bVar2 = ""[uVar25];
      bVar3 = ""[uVar26];
      uVar27 = (int)(uVar12 >> 0x10) + iVar14;
      uVar7 = *(ushort *)
               ((long)CTable_LitLength +
               (long)(int)CTable_LitLength[lVar16 + uVar25 * 2 + 1] * 2 +
               (ulong)(uVar7 >> ((byte)(uVar12 >> 0x10) & 0x3f)) * 2 + 4);
      uVar24 = (uint)bVar2 + (uint)bVar1 + (uint)bVar3;
      puVar13 = puVar19;
      if (0x1e < uVar24) {
        puVar13 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar19);
        if (puVar17 < puVar13) {
          puVar13 = puVar17;
        }
        *puVar19 = uVar18;
        uVar18 = uVar18 >> ((byte)uVar27 & 0x38);
        uVar27 = uVar27 & 7;
      }
      uVar18 = (ulong)((uint)sequences[uVar20].mlBase & BIT_mask[(uint)bVar3]) <<
               ((byte)(uVar27 + bVar2) & 0x3f) |
               (ulong)((uint)sequences[uVar20].litLength & BIT_mask[bVar2]) << ((byte)uVar27 & 0x3f)
               | uVar18;
      uVar27 = uVar27 + bVar2 + (uint)bVar3;
      puVar22 = puVar13;
      if (0x38 < uVar24) {
        puVar22 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar13);
        if (puVar17 < puVar22) {
          puVar22 = puVar17;
        }
        *puVar13 = uVar18;
        uVar18 = uVar18 >> ((byte)uVar27 & 0x38);
        uVar27 = uVar27 & 7;
      }
      if (longOffsets == 0) {
        uVar18 = (ulong)(BIT_mask[uVar23] & sequences[uVar20].offBase) << ((byte)uVar27 & 0x3f) |
                 uVar18;
        uVar27 = uVar27 + bVar1;
      }
      else {
        puVar13 = puVar22;
        if (bVar1 < 0x38) {
          uVar24 = sequences[uVar20].offBase;
          uVar11 = 0;
        }
        else {
          uVar11 = 0;
          uVar24 = sequences[uVar20].offBase;
          if (bVar1 == 0x38) {
            uVar23 = 0x38;
          }
          else {
            uVar11 = (ulong)(bVar1 - 0x38);
            uVar18 = (ulong)(BIT_mask[uVar11] & uVar24) << ((byte)uVar27 & 0x3f) | uVar18;
            uVar27 = (uVar27 + bVar1) - 0x38;
            puVar13 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar22);
            if (puVar17 < puVar13) {
              puVar13 = puVar17;
            }
            *puVar22 = uVar18;
            uVar18 = uVar18 >> ((byte)uVar27 & 0x38);
            uVar27 = uVar27 & 7;
            uVar23 = 0x38;
          }
        }
        uVar18 = (ulong)(uVar24 >> ((byte)uVar11 & 0x1f) & BIT_mask[uVar23]) <<
                 ((byte)uVar27 & 0x3f) | uVar18;
        uVar27 = uVar27 + (int)uVar23;
        puVar22 = puVar13;
      }
      puVar19 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar22);
      if (puVar17 < puVar19) {
        puVar19 = puVar17;
      }
      *puVar22 = uVar18;
      uVar18 = uVar18 >> ((byte)uVar27 & 0x38);
      uVar20 = uVar20 - 1;
      uVar27 = uVar27 & 7;
    } while (uVar20 < nbSeq);
  }
  uVar18 = (ulong)((uint)local_b0 & BIT_mask[uVar4]) << (sbyte)uVar27 | uVar18;
  uVar27 = uVar27 + uVar4;
  puVar13 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar19);
  if (puVar17 < puVar13) {
    puVar13 = puVar17;
  }
  *puVar19 = uVar18;
  uVar20 = (ulong)((uint)local_a8 & BIT_mask[uVar5]) << (sbyte)(uVar27 & 7) |
           uVar18 >> ((byte)uVar27 & 0x38);
  uVar27 = (uVar27 & 7) + (uint)uVar5;
  puVar19 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar13);
  if (puVar17 < puVar19) {
    puVar19 = puVar17;
  }
  *puVar13 = uVar20;
  uVar20 = (ulong)((uint)uVar7 & BIT_mask[uVar6]) << (sbyte)(uVar27 & 7) |
           uVar20 >> ((byte)uVar27 & 0x38);
  uVar27 = (uVar27 & 7) + (uint)uVar6;
  puVar13 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar19);
  if (puVar17 < puVar13) {
    puVar13 = puVar17;
  }
  *puVar19 = uVar20;
  uVar24 = (uVar27 & 7) + 1;
  *puVar13 = uVar20 >> ((byte)uVar27 & 0x38) | 1L << (uVar27 & 7);
  puVar13 = (ulong *)((ulong)(uVar24 >> 3) + (long)puVar13);
  if (puVar17 < puVar13) {
    puVar13 = puVar17;
  }
  if ((puVar17 <= puVar13) ||
     (sVar9 = (long)puVar13 + ((ulong)((uVar24 & 7) != 0) - (long)dst), sVar9 == 0)) {
    sVar9 = 0xffffffffffffffba;
  }
  return sVar9;
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
    DEBUGLOG(5, "ZSTD_encodeSequences: dstCapacity = %u", (unsigned)dstCapacity);
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}